

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exper.c
# Opt level: O3

void losexp(char *drainer)

{
  char cVar1;
  char cVar2;
  boolean bVar3;
  schar sVar4;
  short sVar5;
  int iVar6;
  uint uVar7;
  char *pcVar8;
  long lVar9;
  short sVar10;
  xchar *pxVar11;
  uint uVar12;
  xchar *pxVar13;
  xchar *pxVar14;
  xchar *pxVar15;
  
  if ((drainer == (char *)0x0) || (iVar6 = strcmp(drainer,"#levelchange"), iVar6 != 0)) {
    bVar3 = resists_drli(&youmonst);
    if (bVar3 != '\0') {
      return;
    }
    if (u.ulevel < 2) {
      if (drainer != (char *)0x0) {
        killer_format = 1;
        killer = drainer;
        done(0);
      }
      goto LAB_0019b11e;
    }
LAB_0019b0e1:
    pcVar8 = Goodbye();
    u.ulevel = u.ulevel + -1;
    pline("%s level %d.",pcVar8);
    adjabil(u.ulevel + 1,u.ulevel);
    reset_rndmonst(-1);
  }
  else {
    if (1 < u.ulevel) goto LAB_0019b0e1;
LAB_0019b11e:
    u.uexp = 0;
  }
  iVar6 = newhp();
  u.uhpmax = u.uhpmax - iVar6;
  if (u.uhpmax < 2) {
    u.uhpmax = 1;
  }
  uVar12 = u.uhp - iVar6;
  uVar7 = 1;
  if ((uVar12 == 0 || u.uhp < iVar6) || (uVar7 = u.uhpmax, u.uhp = uVar12, (uint)u.uhpmax < uVar12))
  {
    u.uhp = uVar7;
  }
  iVar6 = (int)urole.xlev;
  pxVar15 = &urace.enadv.hifix;
  if (u.ulevel < iVar6) {
    pxVar15 = &urace.enadv.lofix;
  }
  pxVar13 = &urole.enadv.hifix;
  if (u.ulevel < iVar6) {
    pxVar13 = &urole.enadv.lofix;
  }
  pxVar14 = &urace.enadv.hirnd;
  if (u.ulevel < iVar6) {
    pxVar14 = &urace.enadv.lornd;
  }
  pxVar11 = &urole.enadv.hirnd;
  if (u.ulevel < iVar6) {
    pxVar11 = &urole.enadv.lornd;
  }
  sVar4 = acurr(2);
  cVar1 = *pxVar11;
  cVar2 = *pxVar14;
  uVar7 = mt_random();
  iVar6 = (int)*pxVar15 + (int)*pxVar13 +
          SUB164(ZEXT416(uVar7) % SEXT816((long)cVar2 + (long)cVar1 + (long)(sVar4 / '\x02')),0);
  uVar7 = (ushort)urole.malenum - 0x15a;
  if (uVar7 < 0xf) {
    if ((0x30U >> (uVar7 & 0x1f) & 1) == 0) {
      if ((0x2001U >> (uVar7 & 0x1f) & 1) == 0) {
        if ((0x4080U >> (uVar7 & 0x1f) & 1) != 0) {
          iVar6 = iVar6 * 2;
        }
      }
      else {
        sVar10 = (short)iVar6 * 3;
        sVar5 = (short)iVar6 * 3 + 3;
        if (-1 < sVar10) {
          sVar5 = sVar10;
        }
        iVar6 = (int)sVar5 >> 2;
      }
    }
    else {
      iVar6 = (int)(short)((short)((iVar6 * 3 & 0xffffU) >> 0xf) + (short)(iVar6 * 3)) >> 1;
    }
  }
  u.uenmax = u.uenmax - iVar6;
  if (u.uenmax < 1) {
    u.uenmax = 0;
  }
  u.uen = u.uen - iVar6;
  uVar7 = 0;
  if ((u.uen < 0) || (uVar7 = u.uenmax, (uint)u.uenmax < (uint)u.uen)) {
    u.uen = uVar7;
  }
  if (u.uexp < 1) {
    iflags.botl = '\x01';
    return;
  }
  if (u.ulevel < 10) {
    lVar9 = 10;
    uVar7 = u.ulevel;
  }
  else {
    if (0x13 < (uint)u.ulevel) {
      iVar6 = (u.ulevel + -0x13) * 10000000;
      goto LAB_0019b2ce;
    }
    uVar7 = (uint)(byte)((char)u.ulevel - 10);
    lVar9 = 10000;
  }
  iVar6 = (int)(lVar9 << ((byte)uVar7 & 0x3f));
LAB_0019b2ce:
  u.uexp = iVar6 + -1;
  iflags.botl = '\x01';
  return;
}

Assistant:

void losexp(const char *drainer)		
{
	int num;

	/* override life-drain resistance when handling an explicit
	   wizard mode request to reduce level; never fatal though */
	if (drainer && !strcmp(drainer, "#levelchange"))
	    drainer = 0;
	else
	    if (resists_drli(&youmonst)) return;

	if (u.ulevel > 1) {
		pline("%s level %d.", Goodbye(), u.ulevel--);
		/* remove intrinsic abilities */
		adjabil(u.ulevel + 1, u.ulevel);
		reset_rndmonst(NON_PM);	/* new monster selection */
	} else {
		if (drainer) {
			killer_format = KILLED_BY;
			killer = drainer;
			done(DIED);
		}
		/* no drainer or lifesaved */
		u.uexp = 0;
	}
	num = newhp();
	u.uhpmax -= num;
	if (u.uhpmax < 1) u.uhpmax = 1;
	u.uhp -= num;
	if (u.uhp < 1) u.uhp = 1;
	else if (u.uhp > u.uhpmax) u.uhp = u.uhpmax;

	if (u.ulevel < urole.xlev)
	    num = rn1((int)ACURR(A_WIS)/2 + urole.enadv.lornd + urace.enadv.lornd,
			urole.enadv.lofix + urace.enadv.lofix);
	else
	    num = rn1((int)ACURR(A_WIS)/2 + urole.enadv.hirnd + urace.enadv.hirnd,
			urole.enadv.hifix + urace.enadv.hifix);
	num = enermod(num);		/* M. Stephenson */
	u.uenmax -= num;
	if (u.uenmax < 0) u.uenmax = 0;
	u.uen -= num;
	if (u.uen < 0) u.uen = 0;
	else if (u.uen > u.uenmax) u.uen = u.uenmax;

	if (u.uexp > 0)
		u.uexp = newuexp(u.ulevel) - 1;
	iflags.botl = 1;
}